

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Object::writeTo(Object *this,BinaryWriter *binary)

{
  bool bVar1;
  size_type sVar2;
  size_t in_RCX;
  void *in_RDX;
  BinaryWriter *in_RSI;
  long in_RDI;
  shared_ptr<pbrt::Instance> inst;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range1_2;
  shared_ptr<pbrt::LightSource> ls;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *__range1_1;
  shared_ptr<pbrt::Shape> geom;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *in_stack_fffffffffffffe88;
  BinaryWriter *in_stack_fffffffffffffe90;
  BinaryWriter *in_stack_fffffffffffffec0;
  BinaryWriter *in_stack_fffffffffffffec8;
  undefined1 local_d8 [68];
  int32_t local_94;
  shared_ptr<pbrt::LightSource> *local_80;
  __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
  local_78;
  _Base_ptr local_70;
  undefined4 local_68;
  int32_t local_44;
  shared_ptr<pbrt::Shape> *local_30;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  local_28;
  long local_20;
  undefined4 local_14;
  BinaryWriter *local_10;
  
  local_10 = in_RSI;
  BinaryWriter::write(in_RSI,(int)in_RDI + 0x60,in_RDX,in_RCX);
  sVar2 = std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::size((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  *)(in_RDI + 0x18));
  local_14 = (undefined4)sVar2;
  BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
  local_20 = in_RDI + 0x18;
  local_28._M_current =
       (shared_ptr<pbrt::Shape> *)
       std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
       begin((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *
             )in_stack_fffffffffffffe88);
  local_30 = (shared_ptr<pbrt::Shape> *)
             std::
             vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
             end((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  *)in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator*(&local_28);
    std::shared_ptr<pbrt::Shape>::shared_ptr
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Shape,void>
              ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffe88);
    local_44 = BinaryWriter::serialize(in_stack_fffffffffffffec8,(SP *)in_stack_fffffffffffffec0);
    BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x229522);
    std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x22952f);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator++(&local_28);
  }
  sVar2 = std::
          vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
          ::size((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                  *)(in_RDI + 0x30));
  local_68 = (undefined4)sVar2;
  BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
  local_70 = (_Base_ptr)(in_RDI + 0x30);
  local_78._M_current =
       (shared_ptr<pbrt::LightSource> *)
       std::
       vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
       ::begin((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                *)in_stack_fffffffffffffe88);
  local_80 = (shared_ptr<pbrt::LightSource> *)
             std::
             vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ::end((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                    *)in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator*(&local_78);
    std::shared_ptr<pbrt::LightSource>::shared_ptr
              ((shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffec8 = (BinaryWriter *)(local_d8 + 0x30);
    in_stack_fffffffffffffec0 = local_10;
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::LightSource,void>
              ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffe88);
    local_94 = BinaryWriter::serialize(in_stack_fffffffffffffec8,(SP *)in_stack_fffffffffffffec0);
    BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22968e);
    std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x22969b);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator++(&local_78);
  }
  sVar2 = std::
          vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
          ::size((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                  *)(in_RDI + 0x48));
  local_d8._44_4_ = (undefined4)sVar2;
  BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
  local_d8._32_8_ = in_RDI + 0x48;
  local_d8._24_8_ =
       std::
       vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
       begin(in_stack_fffffffffffffe88);
  local_d8._16_8_ =
       std::
       vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
       end(in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                 *)(local_d8 + 0x18));
    in_stack_fffffffffffffe90 = (BinaryWriter *)local_d8;
    std::shared_ptr<pbrt::Instance>::shared_ptr
              ((shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Instance,void>
              ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe90,
               (shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffe88);
    BinaryWriter::serialize(in_stack_fffffffffffffec8,(SP *)in_stack_fffffffffffffec0);
    BinaryWriter::write<int>(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x2297fa);
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x229807);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                  *)(local_d8 + 0x18));
  }
  return 2;
}

Assistant:

int Object::writeTo(BinaryWriter &binary) 
  {
    binary.write(name);
    binary.write((int32_t)shapes.size());
    for (auto geom : shapes) {
      binary.write(binary.serialize(geom));
    }
    binary.write((int32_t)lightSources.size());
    for (auto ls : lightSources) {
      binary.write(binary.serialize(ls));
    }
    binary.write((int32_t)instances.size());
    for (auto inst : instances) {
      binary.write(binary.serialize(inst));
    }
    return TYPE_OBJECT;
  }